

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O0

bool double_conversion::FastDtoa
               (double v,FastDtoaMode mode,int requested_digits,Vector<char> buffer,int *length,
               int *decimal_point)

{
  char *pcVar1;
  uint in_EDI;
  int *in_R8;
  int *in_R9;
  int decimal_exponent;
  bool result;
  undefined1 in_stack_00000068 [16];
  int *in_stack_000000f0;
  int *in_stack_000000f8;
  FastDtoaMode in_stack_00000104;
  double in_stack_00000108;
  undefined1 in_stack_00000110 [16];
  bool local_31;
  Vector<char> local_10;
  
  if (in_EDI < 2) {
    local_31 = Grisu3(in_stack_00000108,in_stack_00000104,(Vector<char>)in_stack_00000110,
                      in_stack_000000f8,in_stack_000000f0);
  }
  else {
    if (in_EDI != 2) {
      abort();
    }
    local_31 = Grisu3Counted((double)buffer._8_8_,buffer.start_._4_4_,
                             (Vector<char>)in_stack_00000068,(int *)v,
                             (int *)CONCAT44(mode,requested_digits));
  }
  if (local_31 != false) {
    *in_R9 = *in_R8;
    pcVar1 = Vector<char>::operator[](&local_10,*in_R8);
    *pcVar1 = '\0';
  }
  return local_31;
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}